

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ReadOnlyShadowTables(sqlite3 *db)

{
  sqlite3 *db_local;
  
  if (((((db->flags & 0x10000000) == 0) || (db->pVtabCtx != (VtabCtx *)0x0)) || (db->nVdbeExec != 0)
      ) || ((0 < db->nVTrans && (db->aVTrans == (VTable **)0x0)))) {
    db_local._4_4_ = 0;
  }
  else {
    db_local._4_4_ = 1;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ReadOnlyShadowTables(sqlite3 *db){
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( (db->flags & SQLITE_Defensive)!=0
   && db->pVtabCtx==0
   && db->nVdbeExec==0
   && !sqlite3VtabInSync(db)
  ){
    return 1;
  }
#endif
  return 0;
}